

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-rasterize.c
# Opt level: O3

void plutovg_span_buffer_copy(plutovg_span_buffer_t *span_buffer,plutovg_span_buffer_t *source)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  plutovg_span_t *ppVar6;
  int iVar7;
  plutovg_span_t *__src;
  long lVar8;
  
  (span_buffer->spans).size = 0;
  __src = (source->spans).data;
  if ((__src != (plutovg_span_t *)0x0) && (iVar7 = (source->spans).size, 0 < iVar7)) {
    uVar5 = (span_buffer->spans).capacity;
    if ((int)uVar5 < iVar7) {
      uVar4 = 8;
      if (uVar5 != 0) {
        uVar4 = uVar5;
      }
      do {
        uVar5 = uVar4;
        uVar4 = uVar5 * 2;
      } while ((int)uVar5 < iVar7);
      ppVar6 = (plutovg_span_t *)realloc((span_buffer->spans).data,(ulong)uVar5 << 4);
      (span_buffer->spans).data = ppVar6;
      (span_buffer->spans).capacity = uVar5;
      lVar8 = (long)(span_buffer->spans).size;
      __src = (source->spans).data;
      iVar7 = (source->spans).size;
    }
    else {
      ppVar6 = (span_buffer->spans).data;
      lVar8 = 0;
    }
    memcpy(ppVar6 + lVar8,__src,(long)iVar7 << 4);
    piVar1 = &(span_buffer->spans).size;
    *piVar1 = *piVar1 + (source->spans).size;
  }
  iVar7 = source->y;
  iVar2 = source->w;
  iVar3 = source->h;
  span_buffer->x = source->x;
  span_buffer->y = iVar7;
  span_buffer->w = iVar2;
  span_buffer->h = iVar3;
  return;
}

Assistant:

void plutovg_span_buffer_copy(plutovg_span_buffer_t* span_buffer, const plutovg_span_buffer_t* source)
{
    plutovg_array_clear(span_buffer->spans);
    plutovg_array_append(span_buffer->spans, source->spans);
    span_buffer->x = source->x;
    span_buffer->y = source->y;
    span_buffer->w = source->w;
    span_buffer->h = source->h;
}